

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

int on_header(nghttp2_session *session,nghttp2_frame *frame,uint8_t *name,size_t namelen,
             uint8_t *value,size_t valuelen,uint8_t flags,void *userp)

{
  int32_t stream_id;
  HTTP *pHVar1;
  uint *puVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  CURLcode CVar7;
  int iVar8;
  Curl_easy *data;
  void *pvVar9;
  char *pcVar10;
  Curl_easy *pCVar11;
  size_t sVar12;
  char buffer [32];
  
  stream_id = (frame->hd).stream_id;
  sVar12 = namelen;
  data = (Curl_easy *)nghttp2_session_get_stream_user_data(session,stream_id);
  if (data == (Curl_easy *)0x0) {
    return -0x386;
  }
  pHVar1 = (data->req).p.http;
  if ((pHVar1 == (HTTP *)0x0) || (puVar2 = (uint *)pHVar1->h2_ctx, puVar2 == (uint *)0x0)) {
    Curl_failf(data,"Internal NULL stream");
    return -0x386;
  }
  if ((frame->hd).type != '\x05') {
    if ((char)puVar2[0x54] == '\x01') {
      if (((userp != (void *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
         (0 < *(int *)(*userp + 0xc))) {
        Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] trailer: %.*s: %.*s",(ulong)*puVar2,
                          namelen & 0xffffffff,name,valuelen,value);
      }
      CVar7 = Curl_dynhds_add((dynhds *)(puVar2 + 0x36),(char *)name,namelen,(char *)value,valuelen)
      ;
      if (CVar7 != CURLE_OK) {
        return -0x386;
      }
      return 0;
    }
    if ((namelen != 7) || (iVar6 = bcmp(":status",name,7), iVar6 != 0)) {
      CVar7 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)name,(char *)namelen,sVar12);
      if (CVar7 != CURLE_OK) {
        return -0x386;
      }
      CVar7 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)0x6b7b5a,(char *)0x2,sVar12);
      if (CVar7 != CURLE_OK) {
        return -0x386;
      }
      CVar7 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)value,(char *)valuelen,sVar12);
      if (CVar7 != CURLE_OK) {
        return -0x386;
      }
      CVar7 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)0x6dce45,(char *)0x2,sVar12);
      if (CVar7 != CURLE_OK) {
        return -0x386;
      }
      if (userp == (void *)0x0) {
        pCVar11 = (Curl_easy *)0x0;
      }
      else {
        pCVar11 = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 0x10);
      }
      if (pCVar11 != data) {
        Curl_expire(data,0,EXPIRE_RUN_NOW);
      }
      if (userp == (void *)0x0) {
        return 0;
      }
      if ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) == 0) {
        return 0;
      }
      if (*(int *)(*userp + 0xc) < 1) {
        return 0;
      }
      Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] header: %.*s: %.*s",(ulong)*puVar2,
                        namelen & 0xffffffff,name,valuelen,value);
      return 0;
    }
    CVar7 = Curl_http_decode_status((int *)(puVar2 + 0x50),(char *)value,valuelen);
    if (CVar7 != CURLE_OK) {
      return -0x386;
    }
    sVar12 = (size_t)puVar2[0x50];
    curl_msnprintf(buffer,0x20,":status:%u\r");
    CVar7 = Curl_headers_push(data,buffer,'\x10');
    if (CVar7 != CURLE_OK) {
      return -0x386;
    }
    CVar7 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)"HTTP/2 ",(char *)0x7,sVar12);
    if (CVar7 != CURLE_OK) {
      return -0x386;
    }
    CVar7 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)value,(char *)valuelen,sVar12);
    if (CVar7 != CURLE_OK) {
      return -0x386;
    }
    CVar7 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)" \r\n",(char *)0x3,sVar12);
    if (CVar7 != CURLE_OK) {
      return -0x386;
    }
    if (userp == (void *)0x0) {
      pCVar11 = (Curl_easy *)0x0;
    }
    else {
      pCVar11 = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 0x10);
    }
    if (pCVar11 != data) {
      Curl_expire(data,0,EXPIRE_RUN_NOW);
    }
    if (userp == (void *)0x0) {
      return 0;
    }
    if ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) == 0) {
      return 0;
    }
    if (*(int *)(*userp + 0xc) < 1) {
      return 0;
    }
    Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] status: HTTP/2 %03d",(ulong)*puVar2,
                      (ulong)puVar2[0x50]);
    return 0;
  }
  iVar6 = strcmp(":authority",(char *)name);
  if (iVar6 == 0) {
    pcVar10 = curl_maprintf("%s:%d",*(undefined8 *)(*(long *)((long)userp + 0x18) + 0x50),
                            (ulong)*(uint *)(*(long *)((long)userp + 0x18) + 0x46c));
    if (pcVar10 == (char *)0x0) {
      return -0x386;
    }
    iVar6 = curl_strequal(pcVar10,(char *)value);
    bVar5 = true;
    if (iVar6 == 0) {
      lVar4 = *(long *)((long)userp + 0x18);
      iVar6 = 0;
      if ((*(int *)(lVar4 + 0x46c) != *(int *)(*(long *)(lVar4 + 0x2b0) + 0x80)) ||
         (iVar8 = curl_strequal(*(char **)(lVar4 + 0x50),(char *)value), iVar8 == 0)) {
        bVar5 = false;
        nghttp2_submit_rst_stream(session,'\0',stream_id,1);
        iVar6 = -0x386;
      }
    }
    else {
      iVar6 = 0;
      bVar5 = true;
    }
    (*Curl_cfree)(pcVar10);
    if (!bVar5) {
      return iVar6;
    }
  }
  if (*(void **)(puVar2 + 0x4a) == (void *)0x0) {
    puVar2[0x4e] = 10;
    puVar2[0x4f] = 0;
    pvVar9 = (*Curl_cmalloc)(0x50);
    *(void **)(puVar2 + 0x4a) = pvVar9;
    if (pvVar9 != (void *)0x0) {
      puVar2[0x4c] = 0;
      puVar2[0x4d] = 0;
      goto LAB_00506e88;
    }
  }
  else {
    uVar3 = *(ulong *)(puVar2 + 0x4c);
    if (uVar3 != *(ulong *)(puVar2 + 0x4e)) {
LAB_00506e88:
      pcVar10 = curl_maprintf("%s:%s",name,value);
      if (pcVar10 == (char *)0x0) {
        return 0;
      }
      lVar4 = *(long *)(puVar2 + 0x4c);
      *(long *)(puVar2 + 0x4c) = lVar4 + 1;
      *(char **)(*(long *)(puVar2 + 0x4a) + lVar4 * 8) = pcVar10;
      return 0;
    }
    if (uVar3 < 0x3e9) {
      *(ulong *)(puVar2 + 0x4e) = uVar3 * 2;
      pvVar9 = Curl_saferealloc(*(void **)(puVar2 + 0x4a),uVar3 << 4);
      if (pvVar9 != (void *)0x0) {
        *(void **)(puVar2 + 0x4a) = pvVar9;
        goto LAB_00506e88;
      }
    }
    else {
      Curl_failf(data,"Too many PUSH_PROMISE headers");
      (*Curl_cfree)(*(void **)(puVar2 + 0x4a));
    }
    puVar2[0x4a] = 0;
    puVar2[0x4b] = 0;
  }
  return -0x209;
}

Assistant:

static int on_header(nghttp2_session *session, const nghttp2_frame *frame,
                     const uint8_t *name, size_t namelen,
                     const uint8_t *value, size_t valuelen,
                     uint8_t flags,
                     void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct stream_ctx *stream;
  struct Curl_easy *data_s;
  int32_t stream_id = frame->hd.stream_id;
  CURLcode result;
  (void)flags;

  DEBUGASSERT(stream_id); /* should never be a zero stream ID here */

  /* get the stream from the hash based on Stream ID */
  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s)
    /* Receiving a Stream ID not in the hash should not happen, this is an
       internal error more than anything else! */
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  stream = H2_STREAM_CTX(data_s);
  if(!stream) {
    failf(data_s, "Internal NULL stream");
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  /* Store received PUSH_PROMISE headers to be used when the subsequent
     PUSH_PROMISE callback comes */
  if(frame->hd.type == NGHTTP2_PUSH_PROMISE) {
    char *h;

    if(!strcmp(HTTP_PSEUDO_AUTHORITY, (const char *)name)) {
      /* pseudo headers are lower case */
      int rc = 0;
      char *check = aprintf("%s:%d", cf->conn->host.name,
                            cf->conn->remote_port);
      if(!check)
        /* no memory */
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      if(!strcasecompare(check, (const char *)value) &&
         ((cf->conn->remote_port != cf->conn->given->defport) ||
          !strcasecompare(cf->conn->host.name, (const char *)value))) {
        /* This is push is not for the same authority that was asked for in
         * the URL. RFC 7540 section 8.2 says: "A client MUST treat a
         * PUSH_PROMISE for which the server is not authoritative as a stream
         * error of type PROTOCOL_ERROR."
         */
        (void)nghttp2_submit_rst_stream(session, NGHTTP2_FLAG_NONE,
                                        stream_id, NGHTTP2_PROTOCOL_ERROR);
        rc = NGHTTP2_ERR_CALLBACK_FAILURE;
      }
      free(check);
      if(rc)
        return rc;
    }

    if(!stream->push_headers) {
      stream->push_headers_alloc = 10;
      stream->push_headers = malloc(stream->push_headers_alloc *
                                    sizeof(char *));
      if(!stream->push_headers)
        return NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE;
      stream->push_headers_used = 0;
    }
    else if(stream->push_headers_used ==
            stream->push_headers_alloc) {
      char **headp;
      if(stream->push_headers_alloc > 1000) {
        /* this is beyond crazy many headers, bail out */
        failf(data_s, "Too many PUSH_PROMISE headers");
        Curl_safefree(stream->push_headers);
        return NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE;
      }
      stream->push_headers_alloc *= 2;
      headp = Curl_saferealloc(stream->push_headers,
                               stream->push_headers_alloc * sizeof(char *));
      if(!headp) {
        stream->push_headers = NULL;
        return NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE;
      }
      stream->push_headers = headp;
    }
    h = aprintf("%s:%s", name, value);
    if(h)
      stream->push_headers[stream->push_headers_used++] = h;
    return 0;
  }

  if(stream->bodystarted) {
    /* This is a trailer */
    CURL_TRC_CF(data_s, cf, "[%d] trailer: %.*s: %.*s",
                stream->id, (int)namelen, name, (int)valuelen, value);
    result = Curl_dynhds_add(&stream->resp_trailers,
                             (const char *)name, namelen,
                             (const char *)value, valuelen);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    return 0;
  }

  if(namelen == sizeof(HTTP_PSEUDO_STATUS) - 1 &&
     memcmp(HTTP_PSEUDO_STATUS, name, namelen) == 0) {
    /* nghttp2 guarantees :status is received first and only once. */
    char buffer[32];
    result = Curl_http_decode_status(&stream->status_code,
                                     (const char *)value, valuelen);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    msnprintf(buffer, sizeof(buffer), HTTP_PSEUDO_STATUS ":%u\r",
              stream->status_code);
    result = Curl_headers_push(data_s, buffer, CURLH_PSEUDO);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    result = recvbuf_write_hds(cf, data_s, STRCONST("HTTP/2 "));
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    result = recvbuf_write_hds(cf, data_s, (const char *)value, valuelen);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    /* the space character after the status code is mandatory */
    result = recvbuf_write_hds(cf, data_s, STRCONST(" \r\n"));
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    /* if we receive data for another handle, wake that up */
    if(CF_DATA_CURRENT(cf) != data_s)
      Curl_expire(data_s, 0, EXPIRE_RUN_NOW);

    CURL_TRC_CF(data_s, cf, "[%d] status: HTTP/2 %03d",
                stream->id, stream->status_code);
    return 0;
  }

  /* nghttp2 guarantees that namelen > 0, and :status was already
     received, and this is not pseudo-header field . */
  /* convert to an HTTP1-style header */
  result = recvbuf_write_hds(cf, data_s, (const char *)name, namelen);
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  result = recvbuf_write_hds(cf, data_s, STRCONST(": "));
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  result = recvbuf_write_hds(cf, data_s, (const char *)value, valuelen);
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  result = recvbuf_write_hds(cf, data_s, STRCONST("\r\n"));
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  /* if we receive data for another handle, wake that up */
  if(CF_DATA_CURRENT(cf) != data_s)
    Curl_expire(data_s, 0, EXPIRE_RUN_NOW);

  CURL_TRC_CF(data_s, cf, "[%d] header: %.*s: %.*s",
              stream->id, (int)namelen, name, (int)valuelen, value);

  return 0; /* 0 is successful */
}